

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::ExtensionSet::MergeFrom(ExtensionSet *this,ExtensionSet *other)

{
  KeyValue *pKVar1;
  size_t minimum_new_capacity;
  KeyValue *pKVar2;
  long lVar3;
  KeyValue *end_xs;
  KeyValue *pKVar4;
  
  if (this->flat_capacity_ < 0x101) {
    pKVar4 = (this->map_).flat;
    end_xs = pKVar4 + this->flat_size_;
    pKVar2 = (other->map_).flat;
    if (other->flat_capacity_ < 0x101) {
      pKVar1 = pKVar2 + other->flat_size_;
      if (this->flat_size_ == 0 || other->flat_size_ == 0) {
        lVar3 = 0;
      }
      else {
        lVar3 = 0;
        do {
          if (pKVar4->first < pKVar2->first) {
            pKVar4 = pKVar4 + 1;
          }
          else {
            if (pKVar4->first == pKVar2->first) {
              pKVar4 = pKVar4 + 1;
            }
            pKVar2 = pKVar2 + 1;
          }
          lVar3 = lVar3 + 1;
        } while ((pKVar4 != end_xs) && (pKVar2 != pKVar1));
      }
      minimum_new_capacity =
           ((long)pKVar1 - (long)pKVar2 >> 5) + lVar3 + ((long)end_xs - (long)pKVar4 >> 5);
    }
    else {
      minimum_new_capacity =
           (anonymous_namespace)::
           SizeOfUnion<google::protobuf::internal::ExtensionSet::KeyValue*,std::_Rb_tree_iterator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>>
                     (pKVar4,end_xs,(_Base_ptr)(pKVar2->second).descriptor,
                      (_Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
                       )&pKVar2->second);
    }
    GrowCapacity(this,minimum_new_capacity);
  }
  pKVar4 = (other->map_).flat;
  if (0x100 < other->flat_capacity_) {
    ForEach<std::_Rb_tree_iterator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,google::protobuf::internal::ExtensionSet::MergeFrom(google::protobuf::internal::ExtensionSet_const&)::__0>
              ((_Base_ptr)(pKVar4->second).descriptor,
               (_Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
                )&pKVar4->second,(anon_class_8_1_8991fb9c)this);
    return;
  }
  if (other->flat_size_ != 0) {
    pKVar2 = pKVar4 + other->flat_size_;
    do {
      InternalExtensionMergeFrom(this,pKVar4->first,&pKVar4->second);
      pKVar4 = pKVar4 + 1;
    } while (pKVar4 != pKVar2);
  }
  return;
}

Assistant:

void ExtensionSet::MergeFrom(const ExtensionSet& other) {
  if (PROTOBUF_PREDICT_TRUE(!is_large())) {
    if (PROTOBUF_PREDICT_TRUE(!other.is_large())) {
      GrowCapacity(SizeOfUnion(flat_begin(), flat_end(), other.flat_begin(),
                               other.flat_end()));
    } else {
      GrowCapacity(SizeOfUnion(flat_begin(), flat_end(),
                               other.map_.large->begin(),
                               other.map_.large->end()));
    }
  }
  other.ForEach([this](int number, const Extension& ext) {
    this->InternalExtensionMergeFrom(number, ext);
  });
}